

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void samplePushPrevious(Stat4Accum *p,int iChng)

{
  tRowcnt *ptVar1;
  int iVar2;
  ulong uVar3;
  int j;
  long lVar4;
  Stat4Sample *pNew;
  long lVar5;
  
  lVar5 = (long)(p->nCol + -2);
  lVar4 = lVar5 * 0x30;
  do {
    if (lVar5 < iChng) {
      if (iChng < p->nMaxEqZero) {
        uVar3 = (ulong)(uint)p->nSample;
        while (0 < (int)uVar3) {
          uVar3 = uVar3 - 1;
          for (lVar4 = (long)iChng; lVar4 < p->nCol; lVar4 = lVar4 + 1) {
            ptVar1 = p->a[uVar3].anEq;
            if (ptVar1[lVar4] == 0) {
              ptVar1[lVar4] = (p->current).anEq[lVar4];
            }
          }
        }
        p->nMaxEqZero = iChng;
      }
      return;
    }
    pNew = (Stat4Sample *)((long)&p->aBest->anEq + lVar4);
    *(tRowcnt *)(*(long *)((long)&p->aBest->anEq + lVar4) + lVar5 * 4) = (p->current).anEq[lVar5];
    if (p->nSample < p->mxSample) {
LAB_0018279c:
      sampleInsert(p,pNew,(int)lVar5);
    }
    else {
      iVar2 = sampleIsBetter(p,pNew,p->a + p->iMin);
      if (iVar2 != 0) goto LAB_0018279c;
    }
    lVar5 = lVar5 + -1;
    lVar4 = lVar4 + -0x30;
  } while( true );
}

Assistant:

static void samplePushPrevious(Stat4Accum *p, int iChng){
#ifdef SQLITE_ENABLE_STAT4
  int i;

  /* Check if any samples from the aBest[] array should be pushed
  ** into IndexSample.a[] at this point.  */
  for(i=(p->nCol-2); i>=iChng; i--){
    Stat4Sample *pBest = &p->aBest[i];
    pBest->anEq[i] = p->current.anEq[i];
    if( p->nSample<p->mxSample || sampleIsBetter(p, pBest, &p->a[p->iMin]) ){
      sampleInsert(p, pBest, i);
    }
  }

  /* Check that no sample contains an anEq[] entry with an index of
  ** p->nMaxEqZero or greater set to zero. */
  for(i=p->nSample-1; i>=0; i--){
    int j;
    for(j=p->nMaxEqZero; j<p->nCol; j++) assert( p->a[i].anEq[j]>0 );
  }

  /* Update the anEq[] fields of any samples already collected. */
  if( iChng<p->nMaxEqZero ){
    for(i=p->nSample-1; i>=0; i--){
      int j;
      for(j=iChng; j<p->nCol; j++){
        if( p->a[i].anEq[j]==0 ) p->a[i].anEq[j] = p->current.anEq[j];
      }
    }
    p->nMaxEqZero = iChng;
  }
#endif

#if defined(SQLITE_ENABLE_STAT3) && !defined(SQLITE_ENABLE_STAT4)
  if( iChng==0 ){
    tRowcnt nLt = p->current.anLt[0];
    tRowcnt nEq = p->current.anEq[0];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+nEq)/p->nPSample ){
      p->current.isPSample = 1;
      sampleInsert(p, &p->current, 0);
      p->current.isPSample = 0;
    }else 

    /* Or if it is a non-periodic sample. Add it in this case too. */
    if( p->nSample<p->mxSample 
     || sampleIsBetter(p, &p->current, &p->a[p->iMin]) 
    ){
      sampleInsert(p, &p->current, 0);
    }
  }
#endif

#ifndef SQLITE_ENABLE_STAT3_OR_STAT4
  UNUSED_PARAMETER( p );
  UNUSED_PARAMETER( iChng );
#endif
}